

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soa_chunk.c
# Opt level: O0

void * soa_chunk_alloc(soa_chunk_t *chunk,size_t blockSize)

{
  uchar *p;
  size_t blockSize_local;
  soa_chunk_t *chunk_local;
  
  if (chunk->freeBlocks == '\0') {
    chunk_local = (soa_chunk_t *)0x0;
  }
  else {
    chunk_local = (soa_chunk_t *)(chunk->blockData + chunk->firstBlock * blockSize);
    chunk->firstBlock = *(uchar *)&chunk_local->blockData;
    chunk->freeBlocks = chunk->freeBlocks + 0xff;
  }
  return chunk_local;
}

Assistant:

void *soa_chunk_alloc( soa_chunk_t *chunk,size_t blockSize )
{
  unsigned char *p;
  if(chunk->freeBlocks == 0) return (void*) 0;  
  p = chunk->blockData + (chunk->firstBlock * blockSize);
  chunk->firstBlock = *p; //Index of next available block is stored in byte 0 of the free block
  chunk->freeBlocks--;
  return (void*) p;  
}